

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Timer.cpp
# Opt level: O0

bool __thiscall TimerHeap::setTime(TimerHeap *this,timeType_ *now,timeType_ *time)

{
  bool bVar1;
  int iVar2;
  LogStream *this_00;
  Logger local_1000;
  timeType_ *local_28;
  timeType_ *time_local;
  timeType_ *now_local;
  TimerHeap *this_local;
  
  local_28 = time;
  time_local = now;
  now_local = (timeType_ *)this;
  if (((time->sec == 0) || (time->msec == 0)) ||
     (bVar1 = Timer::timeType_::operator<(time,now), !bVar1)) {
    (this->howlong_).it_value.tv_sec = local_28->sec;
    (this->howlong_).it_value.tv_nsec = local_28->msec * 1000000;
    iVar2 = timerfd_settime(this->timerfd_,1,(itimerspec *)&this->howlong_,(itimerspec *)0x0);
    if (iVar2 == -1) {
      this_local._7_1_ = false;
    }
    else {
      this_local._7_1_ = true;
    }
  }
  else {
    Logger::Logger(&local_1000,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Raven65[P]WebServer/net/Timer.cpp"
                   ,0x92);
    this_00 = Logger::stream(&local_1000);
    LogStream::operator<<(this_00,"Timer error ");
    Logger::~Logger(&local_1000);
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool TimerHeap::setTime(const Timer::timeType_& now, const Timer::timeType_& time) {
    if (time.sec != 0 && time.msec != 0 && time < now) {
        LOG <<"Timer error ";
        return false;
    }
    howlong_.it_value.tv_sec = time.sec;
    howlong_.it_value.tv_nsec = time.msec * 1000 * 1000;
    if (timerfd_settime(timerfd_, TFD_TIMER_ABSTIME, &howlong_, NULL) == -1) return false; 
    return true;
}